

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O0

ktx_error_code_e ktxTexture2_WriteToNamedFile(ktxTexture2 *This,char *dstname)

{
  FILE *__stream;
  long in_RDI;
  FILE *dst;
  ktx_error_code_e result;
  FILE *in_stack_00000040;
  ktxTexture2 *in_stack_00000048;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    __stream = (FILE *)ktxFOpenUTF8((char *)CONCAT44(in_stack_ffffffffffffffe4,
                                                     in_stack_ffffffffffffffe0),
                                    in_stack_ffffffffffffffd8);
    if (__stream == (FILE *)0x0) {
      local_4 = KTX_FILE_OPEN_FAILED;
    }
    else {
      local_4 = ktxTexture2_WriteToStdioStream(in_stack_00000048,in_stack_00000040);
      fclose(__stream);
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_WriteToNamedFile(ktxTexture2* This, const char* const dstname)
{
    KTX_error_code result;
    FILE* dst;

    if (!This)
        return KTX_INVALID_VALUE;

    dst = ktxFOpenUTF8(dstname, "wb");
    if (dst) {
        result = ktxTexture2_WriteToStdioStream(This, dst);
        fclose(dst);
    } else
        result = KTX_FILE_OPEN_FAILED;

    return result;
}